

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O2

char * borg_get_parsed_pain(char *pain,_Bool do_plural)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  sVar2 = strlen(pain);
  pcVar3 = (char *)mem_zalloc(sVar2 + 1);
  sVar4 = strlen(pain);
  *pcVar3 = ' ';
  uVar5 = 0;
  uVar6 = 1;
  iVar7 = 0;
  while ((uVar5 < sVar4 && (uVar6 < sVar2))) {
    cVar1 = pain[uVar5];
    if (iVar7 == 0 && cVar1 == '[') {
      iVar7 = 1;
    }
    else if (iVar7 == 1 && cVar1 == '|') {
      iVar7 = 2;
    }
    else if (iVar7 == 0 || cVar1 != ']') {
      if (iVar7 == 2 && do_plural || (bool)(~((iVar7 != 1 || do_plural) != (iVar7 == 0)) & 1)) {
        pcVar3[uVar6] = cVar1;
        uVar6 = uVar6 + 1;
      }
    }
    else {
      iVar7 = 0;
    }
    uVar5 = uVar5 + 1;
  }
  return pcVar3;
}

Assistant:

static char *borg_get_parsed_pain(const char *pain, bool do_plural)
{
    size_t buflen = strlen(pain) + 1;
    char  *buf    = mem_zalloc(buflen);

    int    state  = MSG_PARSE_NORMAL;
    size_t maxlen = strlen(pain);
    size_t pos    = 1;

    /* for the borg, always start with a space */
    buf[0] = ' ';

    /* Put the message characters in the buffer */
    /* XXX This logic should be used everywhere for pluralising strings */
    for (size_t i = 0; i < maxlen && pos < buflen - 1; i++) {
        char cur = pain[i];

        /*
         * The characters '[|]' switch parsing mode and are never output.
         * The syntax is [singular|plural]
         */
        if (state == MSG_PARSE_NORMAL && cur == '[') {
            state = MSG_PARSE_SINGLE;
        } else if (state == MSG_PARSE_SINGLE && cur == '|') {
            state = MSG_PARSE_PLURAL;
        } else if (state != MSG_PARSE_NORMAL && cur == ']') {
            state = MSG_PARSE_NORMAL;
        } else if (state == MSG_PARSE_NORMAL
                   || (state == MSG_PARSE_SINGLE && do_plural == false)
                   || (state == MSG_PARSE_PLURAL && do_plural == true)) {
            /* Copy the characters according to the mode */
            buf[pos++] = cur;
        }
    }
    return buf;
}